

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int growOpArray(Vdbe *v,int nOp)

{
  Parse *pPVar1;
  undefined1 auVar2 [16];
  int iVar3;
  Op *p_00;
  long local_40;
  sqlite3_int64 nNew;
  Parse *p;
  VdbeOp *pNew;
  int nOp_local;
  Vdbe *v_local;
  
  pPVar1 = v->pParse;
  if (v->nOpAlloc == 0) {
    local_40 = 0x2a;
  }
  else {
    local_40 = (long)v->nOpAlloc << 1;
  }
  if (pPVar1->db->aLimit[5] < local_40) {
    sqlite3OomFault(pPVar1->db);
    v_local._4_4_ = 7;
  }
  else {
    p_00 = (Op *)sqlite3DbRealloc(pPVar1->db,v->aOp,local_40 * 0x18);
    if (p_00 != (Op *)0x0) {
      iVar3 = sqlite3DbMallocSize(pPVar1->db,p_00);
      pPVar1->szOpAlloc = iVar3;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (long)pPVar1->szOpAlloc;
      v->nOpAlloc = SUB164(auVar2 / ZEXT816(0x18),0);
      v->aOp = p_00;
    }
    v_local._4_4_ = 7;
    if (p_00 != (Op *)0x0) {
      v_local._4_4_ = 0;
    }
  }
  return v_local._4_4_;
}

Assistant:

static int growOpArray(Vdbe *v, int nOp){
  VdbeOp *pNew;
  Parse *p = v->pParse;

  /* The SQLITE_TEST_REALLOC_STRESS compile-time option is designed to force
  ** more frequent reallocs and hence provide more opportunities for
  ** simulated OOM faults.  SQLITE_TEST_REALLOC_STRESS is generally used
  ** during testing only.  With SQLITE_TEST_REALLOC_STRESS grow the op array
  ** by the minimum* amount required until the size reaches 512.  Normal
  ** operation (without SQLITE_TEST_REALLOC_STRESS) is to double the current
  ** size of the op array or add 1KB of space, whichever is smaller. */
#ifdef SQLITE_TEST_REALLOC_STRESS
  sqlite3_int64 nNew = (v->nOpAlloc>=512 ? 2*(sqlite3_int64)v->nOpAlloc
                        : (sqlite3_int64)v->nOpAlloc+nOp);
#else
  sqlite3_int64 nNew = (v->nOpAlloc ? 2*(sqlite3_int64)v->nOpAlloc
                        : (sqlite3_int64)(1024/sizeof(Op)));
  UNUSED_PARAMETER(nOp);
#endif

  /* Ensure that the size of a VDBE does not grow too large */
  if( nNew > p->db->aLimit[SQLITE_LIMIT_VDBE_OP] ){
    sqlite3OomFault(p->db);
    return SQLITE_NOMEM;
  }

  assert( nOp<=(int)(1024/sizeof(Op)) );
  assert( nNew>=(v->nOpAlloc+nOp) );
  pNew = sqlite3DbRealloc(p->db, v->aOp, nNew*sizeof(Op));
  if( pNew ){
    p->szOpAlloc = sqlite3DbMallocSize(p->db, pNew);
    v->nOpAlloc = p->szOpAlloc/sizeof(Op);
    v->aOp = pNew;
  }
  return (pNew ? SQLITE_OK : SQLITE_NOMEM_BKPT);
}